

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

int64_t __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::GetVariablesToIntegers
          (BinaryPolynomialModel<unsigned_int,_double> *this,uint *index)

{
  size_type sVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var2
  ;
  int64_t iVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sorted_variables;
  
  sVar1 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)this,index);
  if (sVar1 == 0) {
    iVar3 = -1;
  }
  else {
    GetSortedVariables(&sorted_variables,this);
    _Var2 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,__gnu_cxx::__ops::_Iter_less_val>
                      (sorted_variables.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       sorted_variables.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish,index);
    iVar3 = (long)_Var2._M_current -
            (long)sorted_variables.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&sorted_variables.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return iVar3;
}

Assistant:

int64_t GetVariablesToIntegers( const IndexType &index ) const {
      if ( variables_.count( index ) == 0 ) {
        return -1;
      } else {
        std::vector<IndexType> sorted_variables = GetSortedVariables();
        return std::distance(
            sorted_variables.begin(), std::lower_bound( sorted_variables.begin(), sorted_variables.end(), index ) );
      }
    }